

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_functions.cpp
# Opt level: O2

void Am_Delete_Word_Before_Cursor(Am_Object *text)

{
  bool bVar1;
  Am_Code_Flag AVar2;
  uint to;
  Am_Value *pAVar3;
  char *pcVar4;
  size_t sVar5;
  uint uVar6;
  uint from;
  uint uVar7;
  Am_String old_str;
  Am_String local_50;
  Am_Object local_48;
  Am_String local_40;
  Am_Object local_38;
  Am_Object local_30;
  
  pAVar3 = Am_Object::Get(text,0xe4,0);
  bVar1 = Am_Value::operator_cast_to_bool(pAVar3);
  if (bVar1) {
    Am_Object::Am_Object(&local_30,text);
    Am_Delete_Entire_String(&local_30);
    Am_Object::~Am_Object(&local_30);
  }
  else {
    Am_Object::Am_Object(&local_38,text);
    AVar2 = ml_which_code(&local_38);
    Am_Object::~Am_Object(&local_38);
    if (AVar2 == Am_ONE_BYTE_CODE) {
      pAVar3 = Am_Object::Get(text,0xad,0);
      to = Am_Value::operator_cast_to_int(pAVar3);
      pAVar3 = Am_Object::Get(text,0xab,0);
      Am_String::Am_String(&local_50,pAVar3);
      pcVar4 = Am_String::operator_cast_to_char_(&local_50);
      sVar5 = strlen(pcVar4);
      if ((int)to <= (int)sVar5) {
        uVar7 = to;
        while ((uVar6 = (int)to >> 0x1f & to, 0 < (int)uVar7 &&
               (pcVar4 = Am_String::operator_cast_to_char_(&local_50), uVar6 = uVar7,
               pcVar4[(ulong)uVar7 - 1] == ' '))) {
          uVar7 = uVar7 - 1;
        }
        uVar7 = (int)uVar6 >> 0x1f & uVar6;
        while ((from = uVar7, 0 < (int)uVar6 &&
               (pcVar4 = Am_String::operator_cast_to_char_(&local_50), from = uVar6,
               pcVar4[(ulong)uVar6 - 1] != ' '))) {
          uVar6 = uVar6 - 1;
        }
        pcVar4 = Am_String::operator_cast_to_char_(&local_50);
        pcVar4 = Am_Delete_Substring(pcVar4,from,to);
        Am_String::Am_String(&local_40,pcVar4,false);
        Am_Object::Set(text,0xab,&local_40,0);
        Am_String::~Am_String(&local_40);
        Am_Object::Am_Object(&local_48,text);
        Am_Move_Cursor_Left(&local_48,to - from);
        Am_Object::~Am_Object(&local_48);
      }
      Am_String::~Am_String(&local_50);
    }
  }
  return;
}

Assistant:

void
Am_Delete_Word_Before_Cursor(Am_Object text)
{
  if ((bool)text.Get(Am_PENDING_DELETE)) //delete all text first
    Am_Delete_Entire_String(text);
  else if (ml_which_code(text) == Am_TWO_BYTE_CODE)
    ;
  // Space does not exist in two-byte code string.
  else { // Am_ONE_BYTE_CODE or Am_SHIFT_JIS_CODE
    int cursor_index = text.Get(Am_CURSOR_INDEX);
    Am_String old_str = text.Get(Am_TEXT);
    int str_len = strlen(old_str);
    if (cursor_index <= str_len) {
      char *new_str;
      int start_wrd = cursor_index;
      // if there are spaces before the cursor, delete them with the word
      while (start_wrd > 0 && ((const char *)old_str)[start_wrd - 1] == ' ') {
        start_wrd--;
      }
      // delete back to but not including the next space
      while (start_wrd > 0 && ((const char *)old_str)[start_wrd - 1] != ' ') {
        start_wrd--;
      }
      // create a new string, since it changed in size.
      // +1 for the terminating /0
      new_str = Am_Delete_Substring(old_str, start_wrd, cursor_index);
      text.Set(Am_TEXT, Am_String(new_str, false));
      Am_Move_Cursor_Left(text, cursor_index - start_wrd);
    }
  }
}